

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O2

int4 functionalEqualityLevel(Varnode *vn1,Varnode *vn2,Varnode **res1,Varnode **res2)

{
  OpCode OVar1;
  PcodeOp *pPVar2;
  PcodeOp *pPVar3;
  pointer ppVVar4;
  pointer ppVVar5;
  Varnode *pVVar6;
  Varnode *vn2_00;
  Varnode *vn1_00;
  uint uVar7;
  uint uVar8;
  int4 iVar9;
  uint uVar10;
  uint uVar11;
  Varnode *vn2_01;
  ulong uVar12;
  ulong uVar13;
  
  uVar7 = functionalEqualityLevel0(vn1,vn2);
  if (uVar7 != 1) {
    return uVar7;
  }
  pPVar2 = vn1->def;
  pPVar3 = vn2->def;
  OVar1 = pPVar2->opcode->opcode;
  if (OVar1 != pPVar3->opcode->opcode) {
    return 0xffffffff;
  }
  ppVVar4 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar5 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = (uint)((ulong)((long)(pPVar2->inrefs).
                               super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)ppVVar4) >> 3);
  if (uVar7 != (uint)((ulong)((long)(pPVar3->inrefs).
                                    super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar5) >> 3)
     ) {
    return 0xffffffff;
  }
  uVar10 = pPVar2->flags;
  if ((uVar10 & 0x40) != 0) {
    return 0xffffffff;
  }
  if ((pPVar3->flags & 4) != 0) {
    return 0xffffffff;
  }
  if (OVar1 == CPUI_LOAD) {
    if (2 < (int)uVar7) {
      return 0xffffffff;
    }
    if ((pPVar2->start).pc.base != (pPVar3->start).pc.base) {
      return 0xffffffff;
    }
    if ((pPVar2->start).pc.offset != (pPVar3->start).pc.offset) {
      return 0xffffffff;
    }
  }
  else if (2 < (int)uVar7) {
    if (OVar1 != CPUI_PTRADD) {
      return 0xffffffff;
    }
    if ((ppVVar4[2]->loc).offset != (ppVVar5[2]->loc).offset) {
      return 0xffffffff;
    }
    uVar7 = 2;
  }
  uVar12 = 0;
  uVar13 = 0;
  if (0 < (int)uVar7) {
    uVar13 = (ulong)uVar7;
  }
  for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
    res1[uVar12] = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar12];
    res2[uVar12] = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar12];
  }
  pVVar6 = *res1;
  vn2_00 = *res2;
  uVar8 = functionalEqualityLevel0(pVVar6,vn2_00);
  if (uVar8 == 0) {
    if (uVar7 == 1) {
      return 0;
    }
    pVVar6 = res1[1];
    iVar9 = functionalEqualityLevel0(pVVar6,res2[1]);
    if (iVar9 == 0) {
      return 0;
    }
    if (iVar9 < 0) {
      return 0xffffffff;
    }
    *res1 = pVVar6;
    vn2_01 = res2[1];
  }
  else {
    if (uVar7 == 1) {
      return uVar8;
    }
    vn1_00 = res1[1];
    vn2_01 = res2[1];
    iVar9 = functionalEqualityLevel0(vn1_00,vn2_01);
    if (iVar9 == 0) {
      return uVar8;
    }
    uVar7 = (iVar9 == 1 && uVar8 == 1) - 1 | 2;
    if ((uVar10 >> 0xe & 1) == 0) {
      return uVar7;
    }
    uVar10 = functionalEqualityLevel0(pVVar6,vn2_01);
    uVar11 = functionalEqualityLevel0(vn1_00,vn2_00);
    if ((uVar11 | uVar10) == 0) {
      return 0;
    }
    if ((int)(uVar11 | uVar10) < 0) {
      return uVar7;
    }
    if (uVar10 == 0) {
      *res1 = vn1_00;
      return 1;
    }
    if (uVar11 != 0) {
      if (iVar9 != 1 || uVar8 != 1) {
        *res2 = vn2_01;
        res2[1] = vn2_00;
        return 2;
      }
      return 2;
    }
  }
  *res2 = vn2_01;
  return 1;
}

Assistant:

int4 functionalEqualityLevel(Varnode *vn1,Varnode *vn2,Varnode **res1,Varnode **res2)

{
  int4 testval = functionalEqualityLevel0(vn1,vn2);
  if (testval != 1) return testval;
  PcodeOp *op1 = vn1->getDef();
  PcodeOp *op2 = vn2->getDef();
  OpCode opc = op1->code();

  if (opc != op2->code()) return -1;

  int4 num = op1->numInput();
  if (num != op2->numInput()) return -1;
  if (op1->isMarker()) return -1;
  if (op2->isCall()) return -1;
  if (opc == CPUI_LOAD) {
				// FIXME: We assume two loads produce the same
				// result if the address is the same and the loads
				// occur in the same instruction
    if (op1->getAddr() != op2->getAddr()) return -1;
  }
  if (num >= 3) {
    if (opc != CPUI_PTRADD) return -1; // If this is a PTRADD
    if (op1->getIn(2)->getOffset() != op2->getIn(2)->getOffset()) return -1; // Make sure the elsize constant is equal
    num = 2;			// Otherwise treat as having 2 inputs
  }
  for(int4 i=0;i<num;++i) {
    res1[i] = op1->getIn(i);
    res2[i] = op2->getIn(i);
  }

  testval = functionalEqualityLevel0(res1[0],res2[0]);
  if (testval == 0) {	      	// A match locks in this comparison ordering
    if (num==1) return 0;
    testval = functionalEqualityLevel0(res1[1],res2[1]);
    if (testval==0) return 0;
    if (testval < 0) return -1;
    res1[0] = res1[1];		// Match is contingent on second pair
    res2[0] = res2[1];
    return 1;
  }
  if (num == 1) return testval;
  int4 testval2 = functionalEqualityLevel0(res1[1],res2[1]);
  if (testval2 == 0) {		// A match locks in this comparison ordering
    return testval;
  }
  int4 unmatchsize;
  if ((testval==1)&&(testval2==1))
    unmatchsize = 2;
  else
    unmatchsize = -1;

  if (!op1->isCommutative()) return unmatchsize;
  // unmatchsize must be 2 or -1 here on a commutative operator,
  // try flipping
  int4 comm1 = functionalEqualityLevel0(res1[0],res2[1]);
  int4 comm2 = functionalEqualityLevel0(res1[1],res2[0]);
  if ((comm1==0) && (comm2==0))
    return 0;
  if ((comm1<0)||(comm2<0))
    return unmatchsize;
  if (comm1==0)	{		// AND (comm2==1)
    res1[0] = res1[1];		// Left over unmatch is res1[1] and res2[0]
    return 1;
  }
  if (comm2==0) {		// AND (comm1==1)
    res2[0] = res2[1];		// Left over unmatch is res1[0] and res2[1]
    return 1;
  }
  // If we reach here (comm1==1) AND (comm2==1)
  if (unmatchsize == 2)		// If the original ordering wasn't impossible
    return 2;			// Prefer the original ordering
  Varnode *tmpvn = res2[0];	// Otherwise swap the ordering
  res2[0] = res2[1];
  res2[1] = tmpvn;
  return 2;
}